

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Connector.cpp
# Opt level: O0

void __thiscall
helics::apps::Connector::makeConnections(Connector *this,ConnectionsList *possibleConnections)

{
  string_view message;
  format_args args;
  string_view fmt;
  bool bVar1;
  int iVar2;
  int iVar3;
  element_type *peVar4;
  long in_RSI;
  long in_RDI;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *unaff_retaddr;
  Connector *in_stack_00000008;
  undefined1 in_stack_00000010 [16];
  function<void_(std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>)>
  *in_stack_00000030;
  basic_string_view<char,_std::char_traits<char>_> *uEnd_1;
  iterator __end3;
  iterator __begin3;
  vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  *__range3;
  basic_string_view<char,_std::char_traits<char>_> *uEnd;
  iterator __end2_2;
  iterator __begin2_2;
  vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  *__range2_2;
  basic_string_view<char,_std::char_traits<char>_> *uPub;
  iterator __end2_1;
  iterator __begin2_1;
  vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  *__range2_1;
  basic_string_view<char,_std::char_traits<char>_> *uInp;
  iterator __end2;
  iterator __begin2;
  vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  *__range2;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *tagList;
  anon_class_16_2_a9d998db targetEndpointConnector;
  anon_class_16_2_a9d998db sourceEndpointConnector;
  anon_class_16_2_a9d998db pubConnector;
  anon_class_16_2_a9d998db inputConnector;
  int logLevel;
  function<void_(std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>)>
  *in_stack_fffffffffffffcc8;
  __normal_iterator<std::basic_string_view<char,_std::char_traits<char>_>_*,_std::vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
  *in_stack_fffffffffffffcd0;
  Federate *this_00;
  anon_class_16_2_a9d998db *in_stack_fffffffffffffcd8;
  _func_int *p_Var5;
  function<void_(std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>)>
  *in_stack_fffffffffffffce0;
  undefined1 local_268 [88];
  __uniq_ptr_impl<gmlc::libguarded::shared_guarded<helics::AsyncFedCallInfo,_std::mutex>,_std::default_delete<gmlc::libguarded::shared_guarded<helics::AsyncFedCallInfo,_std::mutex>_>_>
  _Stack_210;
  __uniq_ptr_impl<helics::ConnectorFederateManager,_std::default_delete<helics::ConnectorFederateManager>_>
  local_208;
  __uniq_ptr_impl<helics::PotentialInterfacesManager,_std::default_delete<helics::PotentialInterfacesManager>_>
  local_200;
  __normal_iterator<std::basic_string_view<char,_std::char_traits<char>_>_*,_std::vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
  local_1f8;
  _Alloc_hider local_1f0;
  function<void_(std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>)>
  local_1e8;
  undefined8 local_1c8;
  _Manager_type p_Stack_1c0;
  reference local_1b8;
  undefined1 local_1b0 [16];
  _Manager_type local_1a0;
  function<void_(std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>)>
  local_198;
  _Invoker_type local_178;
  _Any_data _Stack_170;
  basic_string_view<char,_std::char_traits<char>_> *local_160;
  __normal_iterator<std::basic_string_view<char,_std::char_traits<char>_>_*,_std::vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
  local_158;
  _Any_data local_150;
  function<void_(std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>)>
  local_138;
  _Invoker_type local_118;
  _Any_data _Stack_110;
  basic_string_view<char,_std::char_traits<char>_> *local_100;
  __normal_iterator<std::basic_string_view<char,_std::char_traits<char>_>_*,_std::vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
  local_f8;
  _Any_data local_f0;
  int local_d8;
  long lVar6;
  int iVar7;
  undefined4 in_stack_ffffffffffffff3c;
  long lVar8;
  int iVar9;
  undefined4 in_stack_ffffffffffffff4c;
  undefined8 local_88 [2];
  undefined8 local_78;
  undefined8 *local_70;
  char *local_68;
  undefined8 uStack_60;
  undefined8 *local_50;
  char *local_48;
  undefined8 uStack_40;
  Federate *local_38;
  undefined8 local_30;
  undefined8 *local_28;
  undefined8 *local_20;
  undefined8 *local_18;
  unordered_multimap<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
  *in_stack_fffffffffffffff0;
  unordered_set<std::basic_string_view<char,_std::char_traits<char>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  *in_stack_fffffffffffffff8;
  
  peVar4 = CLI::std::
           __shared_ptr_access<helics::CombinationFederate,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<helics::CombinationFederate,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x266a10);
  p_Var5 = (peVar4->super_ValueFederate)._vptr_ValueFederate[-3];
  iVar2 = (**(code **)(*(long *)((long)&(peVar4->super_ValueFederate)._vptr_ValueFederate +
                                (long)p_Var5) + 0x48))
                    ((_func_int *)
                     ((long)&(peVar4->super_ValueFederate)._vptr_ValueFederate + (long)p_Var5),0x10f
                    );
  local_f0._8_8_ = in_RSI + 0x2e8;
  local_f0._M_unused._0_8_ = (undefined8)(in_RSI + 0x50);
  local_d8 = iVar2;
  lVar6 = in_RDI;
  iVar7 = iVar2;
  lVar8 = in_RDI;
  iVar9 = iVar2;
  local_f8._M_current =
       (basic_string_view<char,_std::char_traits<char>_> *)
       CLI::std::
       vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
       ::begin((vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                *)in_stack_fffffffffffffcc8);
  local_100 = (basic_string_view<char,_std::char_traits<char>_> *)
              CLI::std::
              vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
              ::end((vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                     *)in_stack_fffffffffffffcc8);
  while (bVar1 = __gnu_cxx::
                 operator==<std::basic_string_view<char,_std::char_traits<char>_>_*,_std::vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
                           (in_stack_fffffffffffffcd0,
                            (__normal_iterator<std::basic_string_view<char,_std::char_traits<char>_>_*,_std::vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
                             *)in_stack_fffffffffffffcc8), ((bVar1 ^ 0xffU) & 1) != 0) {
    _Stack_110._8_8_ =
         __gnu_cxx::
         __normal_iterator<std::basic_string_view<char,_std::char_traits<char>_>_*,_std::vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
         ::operator*(&local_f8);
    local_118 = (_Invoker_type)((reference)_Stack_110._8_8_)->_M_len;
    _Stack_110._M_unused._M_object = ((reference)_Stack_110._8_8_)->_M_str;
    in_stack_fffffffffffffcc8 = &local_138;
    std::
    function<void(std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>)>
    ::function<helics::apps::Connector::makeConnections(helics::apps::ConnectionsList&)::__0&,void>
              (in_stack_fffffffffffffce0,in_stack_fffffffffffffcd8);
    iVar3 = makeTargetConnection
                      (in_stack_00000008,(string_view)in_stack_00000010,unaff_retaddr,
                       in_stack_fffffffffffffff8,in_stack_fffffffffffffff0,in_stack_00000030);
    *(long *)(in_RDI + 0x1a8) = (long)iVar3 + *(long *)(in_RDI + 0x1a8);
    CLI::std::
    function<void_(std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>)>
    ::~function((function<void_(std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>)>
                 *)0x266bf2);
    __gnu_cxx::
    __normal_iterator<std::basic_string_view<char,_std::char_traits<char>_>_*,_std::vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
    ::operator++(&local_f8);
  }
  local_150._M_unused._0_8_ = (undefined8)(in_RSI + 0x38);
  local_158._M_current =
       (basic_string_view<char,_std::char_traits<char>_> *)
       CLI::std::
       vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
       ::begin((vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                *)in_stack_fffffffffffffcc8);
  local_160 = (basic_string_view<char,_std::char_traits<char>_> *)
              CLI::std::
              vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
              ::end((vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                     *)in_stack_fffffffffffffcc8);
  while (bVar1 = __gnu_cxx::
                 operator==<std::basic_string_view<char,_std::char_traits<char>_>_*,_std::vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
                           (in_stack_fffffffffffffcd0,
                            (__normal_iterator<std::basic_string_view<char,_std::char_traits<char>_>_*,_std::vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
                             *)in_stack_fffffffffffffcc8), ((bVar1 ^ 0xffU) & 1) != 0) {
    _Stack_170._8_8_ =
         __gnu_cxx::
         __normal_iterator<std::basic_string_view<char,_std::char_traits<char>_>_*,_std::vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
         ::operator*(&local_158);
    local_178 = (_Invoker_type)((reference)_Stack_170._8_8_)->_M_len;
    _Stack_170._M_unused._M_object = ((reference)_Stack_170._8_8_)->_M_str;
    in_stack_fffffffffffffcc8 = &local_198;
    std::
    function<void(std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>)>
    ::function<helics::apps::Connector::makeConnections(helics::apps::ConnectionsList&)::__1&,void>
              (in_stack_fffffffffffffce0,in_stack_fffffffffffffcd8);
    iVar3 = makeTargetConnection
                      (in_stack_00000008,(string_view)in_stack_00000010,unaff_retaddr,
                       in_stack_fffffffffffffff8,in_stack_fffffffffffffff0,in_stack_00000030);
    *(long *)(in_RDI + 0x1a8) = (long)iVar3 + *(long *)(in_RDI + 0x1a8);
    CLI::std::
    function<void_(std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>)>
    ::~function((function<void_(std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>)>
                 *)0x266d62);
    __gnu_cxx::
    __normal_iterator<std::basic_string_view<char,_std::char_traits<char>_>_*,_std::vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
    ::operator++(&local_158);
  }
  local_1a0 = (_Manager_type)(in_RSI + 0x80);
  local_1b0._8_8_ =
       CLI::std::
       vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
       ::begin((vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                *)in_stack_fffffffffffffcc8);
  local_1b0._0_8_ =
       CLI::std::
       vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
       ::end((vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
              *)in_stack_fffffffffffffcc8);
  while (bVar1 = __gnu_cxx::
                 operator==<std::basic_string_view<char,_std::char_traits<char>_>_*,_std::vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
                           (in_stack_fffffffffffffcd0,
                            (__normal_iterator<std::basic_string_view<char,_std::char_traits<char>_>_*,_std::vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
                             *)in_stack_fffffffffffffcc8), ((bVar1 ^ 0xffU) & 1) != 0) {
    local_1b8 = __gnu_cxx::
                __normal_iterator<std::basic_string_view<char,_std::char_traits<char>_>_*,_std::vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
                ::operator*((__normal_iterator<std::basic_string_view<char,_std::char_traits<char>_>_*,_std::vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
                             *)(local_1b0 + 8));
    local_1c8 = local_1b8->_M_len;
    p_Stack_1c0 = (_Manager_type)local_1b8->_M_str;
    in_stack_fffffffffffffcc8 = &local_1e8;
    std::
    function<void(std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>)>
    ::function<helics::apps::Connector::makeConnections(helics::apps::ConnectionsList&)::__2&,void>
              (in_stack_fffffffffffffce0,in_stack_fffffffffffffcd8);
    iVar3 = makeTargetConnection
                      (in_stack_00000008,(string_view)in_stack_00000010,unaff_retaddr,
                       in_stack_fffffffffffffff8,in_stack_fffffffffffffff0,in_stack_00000030);
    *(long *)(in_RDI + 0x1a8) = (long)iVar3 + *(long *)(in_RDI + 0x1a8);
    CLI::std::
    function<void_(std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>)>
    ::~function((function<void_(std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>)>
                 *)0x266ec8);
    __gnu_cxx::
    __normal_iterator<std::basic_string_view<char,_std::char_traits<char>_>_*,_std::vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
    ::operator++((__normal_iterator<std::basic_string_view<char,_std::char_traits<char>_>_*,_std::vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
                  *)(local_1b0 + 8));
  }
  if ((*(byte *)(in_RDI + 0x1b8) & 1) != 0) {
    local_1f0._M_p = (pointer)(in_RSI + 0x68);
    local_1f8._M_current =
         (basic_string_view<char,_std::char_traits<char>_> *)
         CLI::std::
         vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
         ::begin((vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                  *)in_stack_fffffffffffffcc8);
    local_200._M_t.
    super__Tuple_impl<0UL,_helics::PotentialInterfacesManager_*,_std::default_delete<helics::PotentialInterfacesManager>_>
    .super__Head_base<0UL,_helics::PotentialInterfacesManager_*,_false>._M_head_impl =
         (tuple<helics::PotentialInterfacesManager_*,_std::default_delete<helics::PotentialInterfacesManager>_>
          )CLI::std::
           vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
           ::end((vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                  *)in_stack_fffffffffffffcc8);
    while (bVar1 = __gnu_cxx::
                   operator==<std::basic_string_view<char,_std::char_traits<char>_>_*,_std::vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
                             (in_stack_fffffffffffffcd0,
                              (__normal_iterator<std::basic_string_view<char,_std::char_traits<char>_>_*,_std::vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
                               *)in_stack_fffffffffffffcc8), ((bVar1 ^ 0xffU) & 1) != 0) {
      local_208._M_t.
      super__Tuple_impl<0UL,_helics::ConnectorFederateManager_*,_std::default_delete<helics::ConnectorFederateManager>_>
      .super__Head_base<0UL,_helics::ConnectorFederateManager_*,_false>._M_head_impl =
           (tuple<helics::ConnectorFederateManager_*,_std::default_delete<helics::ConnectorFederateManager>_>
            )__gnu_cxx::
             __normal_iterator<std::basic_string_view<char,_std::char_traits<char>_>_*,_std::vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
             ::operator*(&local_1f8);
      local_268._80_8_ =
           *(undefined8 *)
            local_208._M_t.
            super__Tuple_impl<0UL,_helics::ConnectorFederateManager_*,_std::default_delete<helics::ConnectorFederateManager>_>
            .super__Head_base<0UL,_helics::ConnectorFederateManager_*,_false>._M_head_impl;
      _Stack_210._M_t.
      super__Tuple_impl<0UL,_gmlc::libguarded::shared_guarded<helics::AsyncFedCallInfo,_std::mutex>_*,_std::default_delete<gmlc::libguarded::shared_guarded<helics::AsyncFedCallInfo,_std::mutex>_>_>
      .
      super__Head_base<0UL,_gmlc::libguarded::shared_guarded<helics::AsyncFedCallInfo,_std::mutex>_*,_false>
      ._M_head_impl =
           (tuple<gmlc::libguarded::shared_guarded<helics::AsyncFedCallInfo,_std::mutex>_*,_std::default_delete<gmlc::libguarded::shared_guarded<helics::AsyncFedCallInfo,_std::mutex>_>_>
            )(((shared_guarded_opt<gmlc::containers::StringMappedVector<std::unique_ptr<Filter>_>_>
                *)((long)local_208._M_t.
                         super__Tuple_impl<0UL,_helics::ConnectorFederateManager_*,_std::default_delete<helics::ConnectorFederateManager>_>
                         .super__Head_base<0UL,_helics::ConnectorFederateManager_*,_false>.
                         _M_head_impl + 8))->m_obj).dataStorage.csize;
      in_stack_fffffffffffffcc8 =
           (function<void_(std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>)>
            *)(local_268 + 0x30);
      std::
      function<void(std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>)>
      ::
      function<helics::apps::Connector::makeConnections(helics::apps::ConnectionsList&)::__3&,void>
                (in_stack_fffffffffffffcc8,in_stack_fffffffffffffcd8);
      in_stack_fffffffffffffce0 = in_stack_fffffffffffffcc8;
      iVar3 = makeTargetConnection
                        (in_stack_00000008,(string_view)in_stack_00000010,unaff_retaddr,
                         in_stack_fffffffffffffff8,in_stack_fffffffffffffff0,in_stack_00000030);
      *(long *)(in_RDI + 0x1a8) = (long)iVar3 + *(long *)(in_RDI + 0x1a8);
      CLI::std::
      function<void_(std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>)>
      ::~function((function<void_(std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>)>
                   *)0x267041);
      __gnu_cxx::
      __normal_iterator<std::basic_string_view<char,_std::char_traits<char>_>_*,_std::vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
      ::operator++(&local_1f8);
    }
  }
  if (5 < iVar2) {
    peVar4 = CLI::std::
             __shared_ptr_access<helics::CombinationFederate,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<helics::CombinationFederate,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x26709a);
    p_Var5 = (_func_int *)
             ((long)&(peVar4->super_ValueFederate)._vptr_ValueFederate +
             (long)(peVar4->super_ValueFederate)._vptr_ValueFederate[-3]);
    local_50 = (undefined8 *)(in_RDI + 0x1a8);
    this_00 = (Federate *)local_268;
    local_48 = "{} connections made";
    uStack_40 = 0x13;
    local_68 = "{} connections made";
    uStack_60 = 0x13;
    local_30 = *local_50;
    local_28 = local_88;
    local_18 = &local_78;
    local_78 = 4;
    fmt.size_._0_4_ = iVar9;
    fmt.data_ = (char *)lVar8;
    fmt.size_._4_4_ = in_stack_ffffffffffffff4c;
    args.field_1._0_4_ = iVar7;
    args.desc_ = lVar6;
    args.field_1._4_4_ = in_stack_ffffffffffffff3c;
    local_38 = this_00;
    local_20 = local_28;
    local_88[0] = local_30;
    local_70 = local_28;
    ::fmt::v11::vformat_abi_cxx11_(fmt,args);
    local_268._32_16_ =
         (undefined1  [16])
         std::__cxx11::string::operator_cast_to_basic_string_view
                   ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00);
    message._M_str = (char *)in_stack_fffffffffffffce0;
    message._M_len = (size_t)p_Var5;
    Federate::logInfoMessage(this_00,message);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00);
  }
  return;
}

Assistant:

void Connector::makeConnections(ConnectionsList& possibleConnections)
{
    const int logLevel = fed->getIntegerProperty(HELICS_PROPERTY_INT_LOG_LEVEL);
    auto inputConnector = [this, logLevel](std::string_view target, std::string_view source) {
        core.dataLink(source, target);
        if (logLevel >= HELICS_LOG_LEVEL_CONNECTIONS) {
            fed->logMessage(HELICS_LOG_LEVEL_CONNECTIONS,
                            fmt::format("connecting input {} to publication {}", target, source));
        }
    };
    auto pubConnector = [this, logLevel](std::string_view source, std::string_view target) {
        core.dataLink(source, target);
        if (logLevel >= HELICS_LOG_LEVEL_CONNECTIONS) {
            fed->logMessage(HELICS_LOG_LEVEL_CONNECTIONS,
                            fmt::format("connecting publication {} to input {}", source, target));
        }
    };
    auto sourceEndpointConnector = [this, logLevel](std::string_view source,
                                                    std::string_view target) {
        core.linkEndpoints(source, target);
        if (logLevel >= HELICS_LOG_LEVEL_CONNECTIONS) {
            fed->logMessage(HELICS_LOG_LEVEL_CONNECTIONS,
                            fmt::format("connecting source endpoint {} to target endpoint {}",
                                        source,
                                        target));
        }
    };
    auto targetEndpointConnector = [this, logLevel](std::string_view target,
                                                    std::string_view source) {
        core.linkEndpoints(source, target);
        if (logLevel >= HELICS_LOG_LEVEL_CONNECTIONS) {
            fed->logMessage(HELICS_LOG_LEVEL_CONNECTIONS,
                            fmt::format("connecting target endpoint {} to source endpoint {}",
                                        target,
                                        source));
        }
    };

    const auto& tagList = possibleConnections.tagCodes;
    /** unconnected inputs*/
    for (const auto& uInp : possibleConnections.unconnectedInputs) {
        matchCount += makeTargetConnection(
            uInp, tagList, possibleConnections.pubs, possibleConnections.aliases, inputConnector);
    }
    /** unconnected publications*/
    for (const auto& uPub : possibleConnections.unconnectedPubs) {
        matchCount += makeTargetConnection(
            uPub, tagList, possibleConnections.inputs, possibleConnections.aliases, pubConnector);
    }

    /** unconnected source endpoints*/
    for (const auto& uEnd : possibleConnections.unconnectedSourceEndpoints) {
        matchCount += makeTargetConnection(uEnd,
                                           tagList,
                                           possibleConnections.endpoints,
                                           possibleConnections.aliases,
                                           sourceEndpointConnector);
    }

    if (matchTargetEndpoints) {
        /** unconnected target endpoints*/
        for (const auto& uEnd : possibleConnections.unconnectedTargetEndpoints) {
            matchCount += makeTargetConnection(uEnd,
                                               tagList,
                                               possibleConnections.endpoints,
                                               possibleConnections.aliases,
                                               targetEndpointConnector);
        }
    }
    if (logLevel >= HELICS_LOG_LEVEL_SUMMARY) {
        fed->logInfoMessage(fmt::format("{} connections made", matchCount));
    }
}